

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O0

int archive_write_get_bytes_per_block(archive *_a)

{
  int iVar1;
  int magic_test;
  archive_write *a;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,0x7fff,"archive_write_get_bytes_per_block");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = 0xffffffe2;
  }
  else if ((int)_a[1].current_codepage < 0) {
    _a_local._4_4_ = 1;
  }
  else {
    _a_local._4_4_ = _a[1].current_codepage;
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_write_get_bytes_per_block(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	archive_check_magic(&a->archive, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_ANY, "archive_write_get_bytes_per_block");
	if (a->bytes_per_block < 0) {
		// Don't return a negative value
		return 1;
	}
	return (a->bytes_per_block);
}